

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmlLinkedList.c
# Opt level: O0

void * rmlLinkedListRemoveItem(void *self,void *item)

{
  void *value;
  rmlLinkedListItem *theItem;
  rmlLinkedList *theList;
  void *item_local;
  void *self_local;
  
  if (item == (void *)0x0) {
    self_local = (void *)0x0;
  }
  else if ((((*(long *)((long)item + 8) == 0) && (*(long *)((long)item + 0x10) == 0)) &&
           (item != *self)) && (item != *(void **)((long)self + 8))) {
    self_local = (void *)0x0;
  }
  else {
    if (*(long *)((long)item + 0x10) != 0) {
      *(undefined8 *)(*(long *)((long)item + 0x10) + 8) = *(undefined8 *)((long)item + 8);
    }
    if (*(long *)((long)item + 8) != 0) {
      *(undefined8 *)(*(long *)((long)item + 8) + 0x10) = *(undefined8 *)((long)item + 0x10);
    }
    if (item == *self) {
      *(undefined8 *)self = *(undefined8 *)((long)item + 0x10);
    }
    if (item == *(void **)((long)self + 8)) {
      *(undefined8 *)((long)self + 8) = *(undefined8 *)((long)item + 8);
    }
    *(long *)((long)self + 0x10) = *(long *)((long)self + 0x10) + -1;
    self_local = *item;
    rmlLinkedListItemDestroy((rmlLinkedListItem *)item);
  }
  return self_local;
}

Assistant:

void *rmlLinkedListRemoveItem(void *self, void *item) {
    if (item == NULL) {
        return NULL;
    }

    struct rmlLinkedList *theList = self;
    struct rmlLinkedListItem *theItem = item;
    if (theItem->pre_ == NULL && theItem->next_ == NULL && theItem != theList->head_ && theItem != theList->tail_) {
        return NULL;
    }

    if (theItem->next_ != NULL) {
        theItem->next_->pre_ = theItem->pre_;
    }
    if (theItem->pre_ != NULL) {
        theItem->pre_->next_ = theItem->next_;
    }
    if (item == theList->head_) {
        theList->head_ = theItem->next_;
    }
    if (item == theList->tail_) {
        theList->tail_ = theItem->pre_;
    }
    theList->length_--;

    void *value = theItem->value_;
    rmlLinkedListItemDestroy(item);
    return value;
}